

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::Engine::Put(Engine *this,VariableNT *variable,uint16_t *datum,Mode launch)

{
  Mode in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000018;
  VariableBase *in_stack_00000020;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  Mode local_18;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  local_18 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"in call to Engine::Put",&local_41);
  helper::CheckForNullptr<adios2::core::Engine>((Engine *)in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"for variable in call to Engine::Put",&local_79);
  helper::CheckForNullptr<adios2::core::VariableBase>(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  adios2::core::Engine::Put<unsigned_short>((Variable *)*in_RDI,(ushort *)*local_10,local_18);
  return;
}

Assistant:

void Engine::Get(VariableNT &variable, void *data, const Mode launch)
{
    adios2::helper::CheckForNullptr(m_Engine, "in call to Engine::Get");
    adios2::helper::CheckForNullptr(variable.m_Variable, "for variable in call to Engine::Get");
#define declare_type(T)                                                                            \
    if (variable.m_Variable->m_Type == helper::GetDataType<T>())                                   \
    {                                                                                              \
        m_Engine->Get(*reinterpret_cast<core::Variable<T> *>(variable.m_Variable),                 \
                      reinterpret_cast<T *>(data), launch);                                        \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (variable.m_Variable->m_Type == DataType::Struct)
    {
        m_Engine->Get(*reinterpret_cast<core::VariableStruct *>(variable.m_Variable), data, launch);
    }
}